

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake.c
# Opt level: O0

decaf_error_t decaf_sha3_update(decaf_keccak_sponge_s *decaf_sponge,uint8_t *in,size_t len)

{
  decaf_error_t dVar1;
  ulong uVar2;
  long lVar3;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t *state;
  size_t i;
  size_t cando;
  ulong local_28;
  ulong local_18;
  long local_10;
  
  if (*(byte *)(in_RDI + 0xca) <= *(byte *)(in_RDI + 200)) {
    __assert_fail("decaf_sponge->params->position < decaf_sponge->params->rate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5d,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  if (199 < *(byte *)(in_RDI + 0xca)) {
    __assert_fail("decaf_sponge->params->rate < sizeof(decaf_sponge->state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5e,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(char *)(in_RDI + 0xc9) != 'A') {
    __assert_fail("decaf_sponge->params->flags == FLAG_ABSORBING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/shake.c"
                  ,0x5f,
                  "decaf_error_t decaf_sha3_update(struct decaf_keccak_sponge_s *restrict, const uint8_t *, size_t)"
                 );
  }
  while( true ) {
    if (local_18 == 0) goto LAB_00108935;
    uVar2 = (ulong)(int)((uint)*(byte *)(in_RDI + 0xca) - (uint)*(byte *)(in_RDI + 200));
    lVar3 = in_RDI + (ulong)*(byte *)(in_RDI + 200);
    if (local_18 < uVar2) break;
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      *(byte *)(lVar3 + local_28) = *(byte *)(lVar3 + local_28) ^ *(byte *)(local_10 + local_28);
    }
    dokeccak((decaf_keccak_sponge_s *)0x10890f);
    local_18 = local_18 - uVar2;
    local_10 = uVar2 + local_10;
  }
  for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
    *(byte *)(lVar3 + local_28) = *(byte *)(lVar3 + local_28) ^ *(byte *)(local_10 + local_28);
  }
  *(char *)(in_RDI + 200) = *(char *)(in_RDI + 200) + (char)local_18;
LAB_00108935:
  dVar1 = DECAF_FAILURE;
  if (*(char *)(in_RDI + 0xc9) == 'A') {
    dVar1 = DECAF_SUCCESS;
  }
  return dVar1;
}

Assistant:

decaf_error_t decaf_sha3_update (
    struct decaf_keccak_sponge_s * __restrict__ decaf_sponge,
    const uint8_t *in,
    size_t len
) {
    assert(decaf_sponge->params->position < decaf_sponge->params->rate);
    assert(decaf_sponge->params->rate < sizeof(decaf_sponge->state));
    assert(decaf_sponge->params->flags == FLAG_ABSORBING);
    while (len) {
        size_t cando = decaf_sponge->params->rate - decaf_sponge->params->position, i;
        uint8_t* state = &decaf_sponge->state->b[decaf_sponge->params->position];
        if (cando > len) {
            for (i = 0; i < len; i += 1) state[i] ^= in[i];
            decaf_sponge->params->position += (uint8_t)len;
            break;
        } else {
            for (i = 0; i < cando; i += 1) state[i] ^= in[i];
            dokeccak(decaf_sponge);
            len -= cando;
            in += cando;
        }
    }
    return (decaf_sponge->params->flags == FLAG_ABSORBING) ? DECAF_SUCCESS : DECAF_FAILURE;
}